

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O3

void __thiscall Js::FunctionBody::InitDisableInlineSpread(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  FunctionInfo *pFVar5;
  
  pFVar5 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar5 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    pFVar5 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  if (pFVar5->functionId == 0xffffffff) {
    uVar3 = 0;
  }
  else {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_015a4e90,InlinePhase,
                              ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.
                                   m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->sourceContextInfo).ptr)->
                              sourceContextId,pFVar5->functionId);
    uVar3 = (uint)bVar2 << 0xd;
  }
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffffdfff | uVar3;
  return;
}

Assistant:

void InitDisableInlineSpread()        { disableInlineSpread = this->GetLocalFunctionId() != Js::Constants::NoFunctionId && PHASE_OFF(Js::InlinePhase, this); }